

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O3

void Gia_ManFindXorInt(word *pOff,word *pOn,Vec_Int_t *vBinate,Vec_Ptr_t *vDivs,int nWords,
                      Vec_Int_t *vUnatePairs)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  void *pvVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  
  iVar1 = vBinate->nSize;
  if (0 < (long)iVar1) {
    lVar9 = 0;
    do {
      if (vBinate->nSize <= lVar9) {
LAB_0079d8b5:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (lVar9 != 0) {
        uVar2 = vBinate->pArray[lVar9];
        lVar6 = 0;
LAB_0079d7b6:
        if (lVar6 < vBinate->nSize) {
          uVar7 = vBinate->pArray[lVar6];
          uVar5 = uVar2;
          if ((int)uVar7 < (int)uVar2) {
            uVar5 = uVar7;
          }
          if ((int)uVar7 <= (int)uVar2) {
            uVar7 = uVar2;
          }
          if ((((int)uVar5 < 0) || (vDivs->nSize <= (int)uVar5)) || ((uint)vDivs->nSize <= uVar7)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          if (0 < nWords) {
            pvVar3 = vDivs->pArray[uVar5];
            pvVar4 = vDivs->pArray[uVar7];
            uVar8 = 0;
            do {
              if ((pOff[uVar8] &
                  (*(ulong *)((long)pvVar4 + uVar8 * 8) ^ *(ulong *)((long)pvVar3 + uVar8 * 8))) !=
                  0) {
                uVar8 = 0;
                goto LAB_0079d84f;
              }
              uVar8 = uVar8 + 1;
            } while ((uint)nWords != uVar8);
          }
          if ((short)uVar5 < 0) goto LAB_0079d8d4;
          uVar7 = uVar5 << 0x11 | uVar7 << 2;
          goto LAB_0079d830;
        }
        goto LAB_0079d8b5;
      }
LAB_0079d879:
      lVar9 = lVar9 + 1;
    } while (lVar9 != iVar1);
  }
  return;
  while (uVar8 = uVar8 + 1, (uint)nWords != uVar8) {
LAB_0079d84f:
    if ((pOff[uVar8] &
        ~(*(ulong *)((long)pvVar3 + uVar8 * 8) ^ *(ulong *)((long)pvVar4 + uVar8 * 8))) != 0)
    goto LAB_0079d83f;
  }
  if ((short)uVar5 < 0) {
LAB_0079d8d4:
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
  uVar7 = (uVar5 << 0x11 | uVar7 << 2) + 1;
LAB_0079d830:
  Vec_IntPush(vUnatePairs,uVar7);
LAB_0079d83f:
  lVar6 = lVar6 + 1;
  if (lVar6 == lVar9) goto LAB_0079d879;
  goto LAB_0079d7b6;
}

Assistant:

void Gia_ManFindXorInt( word * pOff, word * pOn, Vec_Int_t * vBinate, Vec_Ptr_t * vDivs, int nWords, Vec_Int_t * vUnatePairs )
{
    int i, k, iDiv0_, iDiv1_;
    int Limit2 = Vec_IntSize(vBinate);//Abc_MinInt( Vec_IntSize(vBinate), 100 );
    Vec_IntForEachEntryStop( vBinate, iDiv1_, i, Limit2 )
    Vec_IntForEachEntryStop( vBinate, iDiv0_, k, i )
    {
        int iDiv0 = Abc_MinInt( iDiv0_, iDiv1_ );
        int iDiv1 = Abc_MaxInt( iDiv0_, iDiv1_ );
        word * pDiv0 = (word *)Vec_PtrEntry(vDivs, iDiv0);
        word * pDiv1 = (word *)Vec_PtrEntry(vDivs, iDiv1);
        if ( !Abc_TtIntersectXor( pOff, 0, pDiv0, pDiv1, 0, nWords ) )
            Vec_IntPush( vUnatePairs, Abc_Var2Lit((Abc_Var2Lit(iDiv0, 0) << 15) | Abc_Var2Lit(iDiv1, 0), 0) );
        else if ( !Abc_TtIntersectXor( pOff, 0, pDiv0, pDiv1, 1, nWords ) )
            Vec_IntPush( vUnatePairs, Abc_Var2Lit((Abc_Var2Lit(iDiv0, 0) << 15) | Abc_Var2Lit(iDiv1, 0), 1) );
    }
}